

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hittable.h
# Opt level: O0

bool __thiscall translate::bounding_box(translate *this,double t0,double t1,aabb *output_box)

{
  uint uVar1;
  element_type *peVar2;
  bool bVar3;
  vec3 local_c0;
  vec3 local_a8;
  vec3 local_90;
  vec3 local_78;
  aabb local_60;
  aabb *local_30;
  aabb *output_box_local;
  double t1_local;
  double t0_local;
  translate *this_local;
  
  local_30 = output_box;
  output_box_local = (aabb *)t1;
  t1_local = t0;
  t0_local = (double)this;
  peVar2 = std::__shared_ptr_access<hittable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<hittable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->ptr);
  uVar1 = (*peVar2->_vptr_hittable[1])(t1_local,output_box_local,peVar2,local_30);
  bVar3 = (uVar1 & 1) != 0;
  if (bVar3) {
    aabb::min(&local_90,local_30);
    operator+(&local_78,&local_90,&this->offset);
    aabb::max(&local_c0,local_30);
    operator+(&local_a8,&local_c0,&this->offset);
    aabb::aabb(&local_60,&local_78,&local_a8);
    memcpy(local_30,&local_60,0x30);
  }
  return bVar3;
}

Assistant:

bool translate::bounding_box(double t0, double t1, aabb& output_box) const {
    if (!ptr->bounding_box(t0, t1, output_box))
        return false;

    output_box = aabb(
            output_box.min() + offset,
            output_box.max() + offset);

    return true;
}